

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

TextureViewGLImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator> *this,
          RenderDeviceGLImpl **CtorArgs,TextureViewDesc *CtorArgs_1,TextureBaseGL **CtorArgs_2,
          bool *CtorArgs_3,bool *CtorArgs_4)

{
  RenderDeviceGLImpl **ppRVar1;
  TextureViewGLImpl *local_50;
  TextureViewGLImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  bool *CtorArgs_local_4;
  bool *CtorArgs_local_3;
  TextureBaseGL **CtorArgs_local_2;
  TextureViewDesc *CtorArgs_local_1;
  RenderDeviceGLImpl **CtorArgs_local;
  MakeNewRCObj<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  ppRVar1 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (TextureViewGLImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (TextureViewGLImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_50 = (TextureViewGLImpl *)
               RefCountedObject<Diligent::ITextureViewGL>::operator_new
                         ((RefCountedObject<Diligent::ITextureViewGL> *)0x78,(size_t)ppRVar1);
    TextureViewGLImpl::TextureViewGLImpl
              (local_50,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1,*CtorArgs_2,
               (bool)(*CtorArgs_3 & 1),(bool)(*CtorArgs_4 & 1));
  }
  else {
    local_50 = (TextureViewGLImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0x78,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    TextureViewGLImpl::TextureViewGLImpl
              (local_50,(IReferenceCounters *)pObj,*CtorArgs,CtorArgs_1,*CtorArgs_2,
               (bool)(*CtorArgs_3 & 1),(bool)(*CtorArgs_4 & 1));
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_50,*(FixedBlockMemoryAllocator **)this);
  }
  return local_50;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }